

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeLoad
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,bool signed_,int bytes,bool isAtomic,Name *mem,Memarg memarg)

{
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var1;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this_00;
  undefined7 in_register_00000089;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_f8;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_d0;
  undefined1 auStack_a8 [8];
  Result<wasm::Name> m;
  undefined1 local_60 [8];
  Result<wasm::Name> _val;
  
  _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_4_ =
       SUB84(CONCAT71(in_register_00000089,signed_),0);
  getMemory((Result<wasm::Name> *)auStack_a8,this,pos,mem);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_60,
             (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_a8);
  if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),(string *)local_60);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&m.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_60);
    if (isAtomic) {
      p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
      if (m.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_a8;
      }
      IRBuilder::makeAtomicLoad
                ((Result<wasm::Ok> *)&local_f8,&this->irBuilder,bytes,(Address)memarg.offset,type,
                 (Name)(p_Var1->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first.
                       _M_storage.super_IString.str);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_f8);
      this_00 = &local_f8;
    }
    else {
      p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
      if (m.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
        p_Var1 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_a8;
      }
      IRBuilder::makeLoad((Result<wasm::Ok> *)&local_d0,&this->irBuilder,bytes,
                          (bool)_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Name,_wasm::Err>._36_1_,
                          (Address)memarg.offset,memarg.align,type,
                          (Name)(p_Var1->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u.
                                _M_first._M_storage.super_IString.str);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_d0);
      this_00 = &local_d0;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (this_00);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_a8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeLoad(Index pos,
                    const std::vector<Annotation>& annotations,
                    Type type,
                    bool signed_,
                    int bytes,
                    bool isAtomic,
                    Name* mem,
                    Memarg memarg) {
    auto m = getMemory(pos, mem);
    CHECK_ERR(m);
    if (isAtomic) {
      return withLoc(pos,
                     irBuilder.makeAtomicLoad(bytes, memarg.offset, type, *m));
    }
    return withLoc(pos,
                   irBuilder.makeLoad(
                     bytes, signed_, memarg.offset, memarg.align, type, *m));
  }